

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugFrame.cpp
# Opt level: O2

void __thiscall
llvm::dwarf::CFIProgram::printOperand
          (CFIProgram *this,raw_ostream *OS,MCRegisterInfo *MRI,bool IsEH,Instruction *Instr,
          uint OperandIdx,uint64_t Operand)

{
  byte bVar1;
  OperandType (*paOVar2) [2];
  raw_ostream *prVar3;
  raw_ostream *prVar4;
  DWARFExpression *this_00;
  undefined7 in_register_00000009;
  undefined *puVar5;
  char *Str;
  StringRef Str_00;
  ArrayRef<llvm::dwarf::CFIProgram::OperandType[2]> local_58;
  uint64_t local_48;
  undefined4 local_3c;
  raw_ostream *local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000009,IsEH);
  local_38 = OS;
  if (1 < OperandIdx) {
    __assert_fail("OperandIdx < 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFDebugFrame.cpp"
                  ,0xdc,
                  "void llvm::dwarf::CFIProgram::printOperand(raw_ostream &, const MCRegisterInfo *, bool, const Instruction &, unsigned int, uint64_t) const"
                 );
  }
  bVar1 = Instr->Opcode;
  local_58 = getOperandTypes();
  paOVar2 = ArrayRef<llvm::dwarf::CFIProgram::OperandType[2]>::operator[](&local_58,(ulong)bVar1);
  prVar4 = local_38;
  switch((*paOVar2)[OperandIdx]) {
  case OT_Unset:
    prVar3 = raw_ostream::operator<<(local_38," Unsupported ");
    Str = "second";
    if (OperandIdx == 0) {
      Str = "first";
    }
    prVar3 = raw_ostream::operator<<(prVar3,Str);
    raw_ostream::operator<<(prVar3," operand to");
    Str_00 = CallFrameString((uint)bVar1,this->Arch);
    if (Str_00.Length != 0) {
      prVar4 = raw_ostream::operator<<(prVar4," ");
      raw_ostream::operator<<(prVar4,Str_00);
      return;
    }
    local_58.Length = (size_type)" Opcode %x";
    local_58.Data = (OperandType (*) [2])&PTR_home_01127e18;
    local_48 = CONCAT71(local_48._1_7_,bVar1);
    goto LAB_00d8a051;
  default:
    goto switchD_00d89e9e_caseD_1;
  case OT_Address:
    local_58.Length = 0xe81d02;
    break;
  case OT_Offset:
    local_58.Length = 0xe8067c;
    goto LAB_00d8a033;
  case OT_FactoredCodeOffset:
    local_48 = this->CodeAlignmentFactor;
    if (local_48 == 0) {
      local_58.Length = 0xe80687;
      break;
    }
LAB_00d89fa2:
    puVar5 = &format_object<unsigned_long>::vtable;
LAB_00d89fe1:
    local_48 = local_48 * Operand;
    local_58.Length = (size_type)" %ld";
    local_58.Data = (OperandType (*) [2])(puVar5 + 0x10);
    goto LAB_00d8a051;
  case OT_SignedFactDataOffset:
    local_48 = this->DataAlignmentFactor;
    if (local_48 != 0) {
      puVar5 = &format_object<long>::vtable;
      goto LAB_00d89fe1;
    }
    local_58.Length = 0xe806a2;
LAB_00d8a033:
    puVar5 = &format_object<long>::vtable;
    goto LAB_00d8a042;
  case OT_UnsignedFactDataOffset:
    local_48 = this->DataAlignmentFactor;
    if (local_48 != 0) goto LAB_00d89fa2;
    local_58.Length = 0xe806a2;
    break;
  case OT_Register:
    local_58.Length = 0xe806bd;
    break;
  case OT_Expression:
    if ((Instr->Expression).Storage.hasVal == false) {
      __assert_fail("Instr.Expression && \"missing DWARFExpression object\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFDebugFrame.cpp"
                    ,0x10b,
                    "void llvm::dwarf::CFIProgram::printOperand(raw_ostream &, const MCRegisterInfo *, bool, const Instruction &, unsigned int, uint64_t) const"
                   );
    }
    raw_ostream::operator<<(local_38," ");
    this_00 = optional_detail::OptionalStorage<llvm::DWARFExpression,_true>::getValue
                        (&(Instr->Expression).Storage);
    DWARFExpression::print(this_00,prVar4,MRI,(DWARFUnit *)0x0,local_3c._0_1_);
    goto switchD_00d89e9e_caseD_1;
  }
  puVar5 = &format_object<unsigned_long>::vtable;
LAB_00d8a042:
  local_58.Data = (OperandType (*) [2])(puVar5 + 0x10);
  local_48 = Operand;
LAB_00d8a051:
  raw_ostream::operator<<(prVar4,(format_object_base *)&local_58);
switchD_00d89e9e_caseD_1:
  return;
}

Assistant:

void CFIProgram::printOperand(raw_ostream &OS, const MCRegisterInfo *MRI,
                              bool IsEH, const Instruction &Instr,
                              unsigned OperandIdx, uint64_t Operand) const {
  assert(OperandIdx < 2);
  uint8_t Opcode = Instr.Opcode;
  OperandType Type = getOperandTypes()[Opcode][OperandIdx];

  switch (Type) {
  case OT_Unset: {
    OS << " Unsupported " << (OperandIdx ? "second" : "first") << " operand to";
    auto OpcodeName = CallFrameString(Opcode, Arch);
    if (!OpcodeName.empty())
      OS << " " << OpcodeName;
    else
      OS << format(" Opcode %x",  Opcode);
    break;
  }
  case OT_None:
    break;
  case OT_Address:
    OS << format(" %" PRIx64, Operand);
    break;
  case OT_Offset:
    // The offsets are all encoded in a unsigned form, but in practice
    // consumers use them signed. It's most certainly legacy due to
    // the lack of signed variants in the first Dwarf standards.
    OS << format(" %+" PRId64, int64_t(Operand));
    break;
  case OT_FactoredCodeOffset: // Always Unsigned
    if (CodeAlignmentFactor)
      OS << format(" %" PRId64, Operand * CodeAlignmentFactor);
    else
      OS << format(" %" PRId64 "*code_alignment_factor" , Operand);
    break;
  case OT_SignedFactDataOffset:
    if (DataAlignmentFactor)
      OS << format(" %" PRId64, int64_t(Operand) * DataAlignmentFactor);
    else
      OS << format(" %" PRId64 "*data_alignment_factor" , int64_t(Operand));
    break;
  case OT_UnsignedFactDataOffset:
    if (DataAlignmentFactor)
      OS << format(" %" PRId64, Operand * DataAlignmentFactor);
    else
      OS << format(" %" PRId64 "*data_alignment_factor" , Operand);
    break;
  case OT_Register:
    OS << format(" reg%" PRId64, Operand);
    break;
  case OT_Expression:
    assert(Instr.Expression && "missing DWARFExpression object");
    OS << " ";
    Instr.Expression->print(OS, MRI, nullptr, IsEH);
    break;
  }
}